

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Equality.h
# Opt level: O1

ptr<Value> __thiscall Equality::asStrings(Equality *this,string *leftOperand,string *rightOperand)

{
  size_t __n;
  int iVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  _func_int **pp_Var2;
  undefined8 *in_RCX;
  bool bVar3;
  ptr<Value> pVar4;
  
  __n = rightOperand->_M_string_length;
  if (__n == in_RCX[1]) {
    if (__n == 0) {
      bVar3 = true;
    }
    else {
      iVar1 = bcmp((rightOperand->_M_dataplus)._M_p,(void *)*in_RCX,__n);
      bVar3 = iVar1 == 0;
    }
  }
  else {
    bVar3 = false;
  }
  pp_Var2 = (_func_int **)operator_new(0x20);
  pp_Var2[1] = (_func_int *)0x100000001;
  *pp_Var2 = (_func_int *)&PTR___Sp_counted_ptr_inplace_0012f608;
  pp_Var2[2] = (_func_int *)&PTR__Member_0012f658;
  *(bool *)(pp_Var2 + 3) = bVar3;
  (this->super_Operation)._vptr_Operation = pp_Var2 + 2;
  this[1].super_Operation._vptr_Operation = pp_Var2;
  pVar4.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&PTR__Member_0012f658;
  pVar4.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (ptr<Value>)pVar4.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<Value> asStrings(const std::string &leftOperand, const std::string &rightOperand) override {
        return make<Boolean>(leftOperand == rightOperand);
    }